

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::matrix_svd<double,3,4>
               (Matrix<double,_3,_4> *mat_a,Matrix<double,_3,_4> *mat_u,Matrix<double,_4,_4> *mat_s,
               Matrix<double,_4,_4> *mat_v,double *epsilon)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  
  matrix_svd<double>(mat_a->m,3,4,mat_u->m,mat_s->m,mat_v->m,epsilon);
  if (mat_s != (Matrix<double,_4,_4> *)0x0) {
    for (lVar2 = 0x20; lVar2 != 0x80; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)mat_s->m + lVar2) = 0;
    }
    pdVar3 = mat_s->m;
    for (lVar2 = 1; pdVar3 = pdVar3 + 5, lVar2 != 4; lVar2 = lVar2 + 1) {
      dVar1 = mat_s->m[lVar2];
      mat_s->m[lVar2] = *pdVar3;
      *pdVar3 = dVar1;
    }
  }
  return;
}

Assistant:

void
matrix_svd (Matrix<T, M, N> const& mat_a, Matrix<T, M, N>* mat_u,
    Matrix<T, N, N>* mat_s, Matrix<T, N, N>* mat_v, T const& epsilon)
{
    T* mat_u_ptr = mat_u ? mat_u->begin() : nullptr;
    T* mat_s_ptr = mat_s ? mat_s->begin() : nullptr;
    T* mat_v_ptr = mat_v ? mat_v->begin() : nullptr;

    matrix_svd<T>(mat_a.begin(), M, N,
        mat_u_ptr, mat_s_ptr, mat_v_ptr, epsilon);

    /* Swap elements of S into place. */
    if (mat_s_ptr)
    {
        std::fill(mat_s_ptr + N, mat_s_ptr + N * N, T(0));
        for (int x = 1, i = N + 1; x < N; ++x, i += N + 1)
            std::swap(mat_s_ptr[x], mat_s_ptr[i]);
    }
}